

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O1

int key_entry_cmp(void *arg,void *obj)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 1;
  if (*(int *)((long)arg + 0x14) == *(int *)((long)obj + 0x14)) {
    auVar6[0] = -(*obj == *arg);
    auVar6[1] = -(*(char *)((long)obj + 1) == *(char *)((long)arg + 1));
    auVar6[2] = -(*(char *)((long)obj + 2) == *(char *)((long)arg + 2));
    auVar6[3] = -(*(char *)((long)obj + 3) == *(char *)((long)arg + 3));
    auVar6[4] = -(*(char *)((long)obj + 4) == *(char *)((long)arg + 4));
    auVar6[5] = -(*(char *)((long)obj + 5) == *(char *)((long)arg + 5));
    auVar6[6] = -(*(char *)((long)obj + 6) == *(char *)((long)arg + 6));
    auVar6[7] = -(*(char *)((long)obj + 7) == *(char *)((long)arg + 7));
    auVar6[8] = -(*(char *)((long)obj + 8) == *(char *)((long)arg + 8));
    auVar6[9] = -(*(char *)((long)obj + 9) == *(char *)((long)arg + 9));
    auVar6[10] = -(*(char *)((long)obj + 10) == *(char *)((long)arg + 10));
    auVar6[0xb] = -(*(char *)((long)obj + 0xb) == *(char *)((long)arg + 0xb));
    auVar6[0xc] = -(*(char *)((long)obj + 0xc) == *(char *)((long)arg + 0xc));
    auVar6[0xd] = -(*(char *)((long)obj + 0xd) == *(char *)((long)arg + 0xd));
    auVar6[0xe] = -(*(char *)((long)obj + 0xe) == *(char *)((long)arg + 0xe));
    auVar6[0xf] = -(*(char *)((long)obj + 0xf) == *(char *)((long)arg + 0xf));
    uVar1 = *(undefined4 *)((long)arg + 0x10);
    uVar2 = *(undefined4 *)((long)obj + 0x10);
    auVar7[0] = -((char)uVar2 == (char)uVar1);
    auVar7[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
    auVar7[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
    auVar7[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
    auVar7[4] = 0xff;
    auVar7[5] = 0xff;
    auVar7[6] = 0xff;
    auVar7[7] = 0xff;
    auVar7[8] = 0xff;
    auVar7[9] = 0xff;
    auVar7[10] = 0xff;
    auVar7[0xb] = 0xff;
    auVar7[0xc] = 0xff;
    auVar7[0xd] = 0xff;
    auVar7[0xe] = 0xff;
    auVar7[0xf] = 0xff;
    auVar7 = auVar7 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
      iVar4 = bcmp((void *)((long)arg + 0x18),(void *)((long)obj + 0x18),0x5b);
      if (iVar4 == 0) {
        uVar5 = (uint)(*(long *)((long)arg + 0x78) != *(long *)((long)obj + 0x78));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return uVar5;
  }
  __stack_chk_fail();
}

Assistant:

static int key_entry_cmp(const void *arg, const void *obj)
{
	const struct key_entry *param = arg;
	const struct key_entry *entry = obj;

	if (param->asn != entry->asn)
		return 1;
	if (memcmp(param->ski, entry->ski, sizeof(entry->ski)))
		return 1;
	if (memcmp(param->spki, entry->spki, sizeof(entry->spki)))
		return 1;
	if (param->socket != entry->socket)
		return 1;

	return 0;
}